

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void prvTidyErrorSummary(TidyDocImpl *doc)

{
  int iVar1;
  char *pcStack_18;
  int charenc;
  ctmbstr encnam;
  TidyDocImpl *doc_local;
  
  pcStack_18 = tidyLocalizedString(0x1fe);
  iVar1 = (int)(doc->config).value[8].v;
  if (iVar1 == 7) {
    pcStack_18 = "Windows-1252";
  }
  else if (iVar1 == 6) {
    pcStack_18 = "MacRoman";
  }
  else if (iVar1 == 8) {
    pcStack_18 = "ibm858";
  }
  else if (iVar1 == 2) {
    pcStack_18 = "latin0";
  }
  if (((doc->badAccess & 0x30) != 0) &&
     (((doc->badAccess & 0x10) == 0 || ((doc->badAccess & 0x20) != 0)))) {
    doc->badAccess = doc->badAccess & 0xffffffcf;
  }
  if (doc->badChars != 0) {
    if ((doc->badChars & 1) != 0) {
      prvTidyDialogue(doc,0x219,pcStack_18);
    }
    if (((doc->badChars & 2) != 0) || ((doc->badChars & 0x40) != 0)) {
      prvTidyDialogue(doc,0x212,pcStack_18);
    }
    if ((doc->badChars & 4) != 0) {
      prvTidyDialogue(doc,0x20d);
    }
    if ((doc->badChars & 8) != 0) {
      prvTidyDialogue(doc,0x20c);
    }
    if ((doc->badChars & 0x20) != 0) {
      prvTidyDialogue(doc,0x20b);
    }
  }
  if (doc->badForm != 0) {
    if ((doc->badForm & 1) != 0) {
      prvTidyDialogue(doc,0x208);
    }
    if ((doc->badForm & 2) != 0) {
      prvTidyDialogue(doc,0x209);
    }
  }
  if (doc->badAccess != 0) {
    if ((doc->config).value[1].v == 0) {
      if ((doc->badAccess & 4) != 0) {
        prvTidyDialogue(doc,0x211);
      }
      if ((doc->badAccess & 1) != 0) {
        prvTidyDialogue(doc,0x20e);
      }
      if ((doc->badAccess & 8) != 0) {
        prvTidyDialogue(doc,0x20f);
      }
      if ((doc->badAccess & 2) != 0) {
        prvTidyDialogue(doc,0x210);
      }
      if (((doc->badAccess & 0x10) != 0) && ((doc->badAccess & 0x20) == 0)) {
        prvTidyDialogue(doc,0x215);
      }
    }
    if ((doc->config).value[1].v == 0) {
      prvTidyDialogue(doc,0x206);
    }
    else {
      prvTidyDialogue(doc,0x207);
    }
  }
  if (doc->badLayout != 0) {
    if ((doc->badLayout & 2) != 0) {
      prvTidyDialogue(doc,0x216);
    }
    if ((doc->badLayout & 1) != 0) {
      prvTidyDialogue(doc,0x218);
    }
    if ((doc->badLayout & 8) != 0) {
      prvTidyDialogue(doc,0x214);
    }
    if ((doc->badLayout & 4) != 0) {
      prvTidyDialogue(doc,0x217);
    }
    if ((doc->badLayout & 0x10) != 0) {
      prvTidyDialogue(doc,0x213);
    }
  }
  if ((doc->footnotes != 0) && ((doc->footnotes & 1) != 0)) {
    prvTidyDialogue(doc,0x205);
  }
  return;
}

Assistant:

void TY_(ErrorSummary)( TidyDocImpl* doc )
{
    ctmbstr encnam = tidyLocalizedString(STRING_SPECIFIED);
    int charenc = cfg( doc, TidyCharEncoding ); 
    if ( charenc == WIN1252 ) 
        encnam = "Windows-1252";
    else if ( charenc == MACROMAN )
        encnam = "MacRoman";
    else if ( charenc == IBM858 )
        encnam = "ibm858";
    else if ( charenc == LATIN0 )
        encnam = "latin0";

    /* adjust badAccess to that it is 0 if frames are ok */
    if ( doc->badAccess & (BA_USING_FRAMES | BA_USING_NOFRAMES) )
    {
        if (!((doc->badAccess & BA_USING_FRAMES) && !(doc->badAccess & BA_USING_NOFRAMES)))
        {
            doc->badAccess &= ~(BA_USING_FRAMES | BA_USING_NOFRAMES);
        }
    }

    if (doc->badChars)
    {
        if (doc->badChars & BC_VENDOR_SPECIFIC_CHARS)
            TY_(Dialogue)( doc, TEXT_VENDOR_CHARS, encnam );

        if ((doc->badChars & BC_INVALID_SGML_CHARS) || (doc->badChars & BC_INVALID_NCR))
            TY_(Dialogue)( doc, TEXT_SGML_CHARS, encnam );

        if (doc->badChars & BC_INVALID_UTF8)
            TY_(Dialogue)( doc, TEXT_INVALID_UTF8 );

        if (doc->badChars & BC_INVALID_UTF16)
            TY_(Dialogue)( doc, TEXT_INVALID_UTF16 );

        if (doc->badChars & BC_INVALID_URI)
            TY_(Dialogue)( doc, TEXT_INVALID_URI );
    }
    
    if (doc->badForm)
    {
        if (doc->badForm & flg_BadForm) /* Issue #166 - changed to BIT flag to support other errors */
            TY_(Dialogue)( doc, TEXT_BAD_FORM );

        if (doc->badForm & flg_BadMain) /* Issue #166 - repeated <main> element */
            TY_(Dialogue)( doc, TEXT_BAD_MAIN );
    }

    if (doc->badAccess)
    {
        /* Tidy "classic" accessibility tests */
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            if (doc->badAccess & BA_MISSING_SUMMARY)
                TY_(Dialogue)( doc, TEXT_M_SUMMARY );

            if (doc->badAccess & BA_MISSING_IMAGE_ALT)
                TY_(Dialogue)( doc, TEXT_M_IMAGE_ALT );

            if (doc->badAccess & BA_MISSING_IMAGE_MAP)
                TY_(Dialogue)( doc, TEXT_M_IMAGE_MAP );

            if (doc->badAccess & BA_MISSING_LINK_ALT)
                TY_(Dialogue)( doc, TEXT_M_LINK_ALT );

            if ((doc->badAccess & BA_USING_FRAMES) && !(doc->badAccess & BA_USING_NOFRAMES))
                TY_(Dialogue)( doc, TEXT_USING_FRAMES );
        }

        if ( cfg(doc, TidyAccessibilityCheckLevel) > 0 )
            TY_(Dialogue)( doc, TEXT_ACCESS_ADVICE2 );
        else
            TY_(Dialogue)( doc, TEXT_ACCESS_ADVICE1 );
    }

    if (doc->badLayout)
    {
        if (doc->badLayout & USING_LAYER)
            TY_(Dialogue)( doc, TEXT_USING_LAYER );

        if (doc->badLayout & USING_SPACER)
            TY_(Dialogue)( doc, TEXT_USING_SPACER );

        if (doc->badLayout & USING_FONT)
            TY_(Dialogue)( doc, TEXT_USING_FONT );

        if (doc->badLayout & USING_NOBR)
            TY_(Dialogue)( doc, TEXT_USING_NOBR );
        
        if (doc->badLayout & USING_BODY)
            TY_(Dialogue)( doc, TEXT_USING_BODY );
    }
    
    if (doc->footnotes)
    {
        if (doc->footnotes & FN_TRIM_EMPTY_ELEMENT)
            TY_(Dialogue)( doc, FOOTNOTE_TRIM_EMPTY_ELEMENT );
    }
}